

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O1

int coda_cursor_goto(coda_cursor *cursor,char *path)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  long index;
  coda_type *type;
  int n;
  long local_48;
  coda_type *local_40;
  int local_34;
  
  local_40 = (coda_type *)0x0;
  uVar8 = 0;
  if (*path == '/') {
    iVar2 = coda_cursor_goto_root(cursor);
    if (iVar2 != 0) {
      return -1;
    }
    uVar4 = (byte)path[1] - 0x2f;
    if (((uVar4 < 0x2d) && ((0x100000020001U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) || (path[1] == 0))
    {
      uVar8 = 1;
    }
  }
LAB_0012d33b:
  do {
    while( true ) {
      uVar4 = (uint)uVar8;
      bVar1 = path[(int)uVar4];
      if (0x3f < bVar1) break;
      if (bVar1 == 0x2f) {
        uVar4 = uVar4 + 1;
      }
      else {
        if (bVar1 == 0) {
          return 0;
        }
LAB_0012d49c:
        if (0 < (int)uVar4) {
          coda_set_error(-100,"invalid path \'%s\' (missing \'/\'?)");
          return -1;
        }
      }
      lVar9 = 0;
      while( true ) {
        bVar1 = (path + (int)uVar4)[lVar9];
        uVar7 = bVar1 - 0x2f;
        if (((uVar7 < 0x2d) && ((0x100000020001U >> ((ulong)uVar7 & 0x3f) & 1) != 0)) ||
           (bVar1 == 0)) break;
        lVar9 = lVar9 + 1;
      }
      uVar8 = (ulong)uVar4 + lVar9;
      iVar2 = (int)lVar9;
      if ((iVar2 != 1) || (path[(int)uVar4] != '.')) {
        if ((iVar2 == 2) && ((path[(int)uVar4] == '.' && (path[(long)(int)uVar4 + 1] == '.')))) {
          iVar2 = coda_cursor_goto_parent(cursor);
          if (iVar2 != 0) {
            return -1;
          }
        }
        else {
          iVar3 = coda_cursor_get_type(cursor,&local_40);
          if (iVar3 != 0) {
            return -1;
          }
          iVar2 = coda_type_get_record_field_index_from_name_n
                            (local_40,path + (int)uVar4,iVar2,&local_48);
          if (iVar2 != 0) {
            return -1;
          }
          iVar2 = coda_cursor_goto_record_field_by_index(cursor,local_48);
          if (iVar2 != 0) {
            return -1;
          }
        }
      }
    }
    if (bVar1 != 0x5b) {
      if (bVar1 != 0x40) goto LAB_0012d49c;
      iVar2 = coda_cursor_goto_attributes(cursor);
      if (iVar2 != 0) {
        return -1;
      }
      uVar7 = uVar4 + 1;
      lVar9 = 0;
      while( true ) {
        bVar1 = (path + (int)uVar7)[lVar9];
        uVar5 = bVar1 - 0x2f;
        if (((uVar5 < 0x2d) && ((0x100000020001U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) ||
           (bVar1 == 0)) break;
        lVar9 = lVar9 + 1;
      }
      iVar2 = (int)lVar9;
      if ((iVar2 != 1) || (path[(int)uVar7] != '.')) {
        if ((iVar2 == 2) && ((path[(int)uVar7] == '.' && (path[(long)(int)uVar4 + 2] == '.')))) {
          iVar2 = coda_cursor_goto_parent(cursor);
        }
        else {
          if ((int)((ulong)uVar7 + lVar9) <= (int)uVar7) goto LAB_0012d48c;
          iVar3 = coda_cursor_get_type(cursor,&local_40);
          if (iVar3 != 0) {
            return -1;
          }
          iVar2 = coda_type_get_record_field_index_from_name_n
                            (local_40,path + (int)uVar7,iVar2,&local_48);
          if (iVar2 != 0) {
            return -1;
          }
          iVar2 = coda_cursor_goto_record_field_by_index(cursor,local_48);
        }
        if (iVar2 != 0) {
          return -1;
        }
      }
LAB_0012d48c:
      uVar8 = (ulong)uVar7 + lVar9 & 0xffffffff;
      goto LAB_0012d33b;
    }
    uVar7 = uVar4 + 1;
    pcVar6 = path + (int)uVar7;
    for (uVar8 = 0; pcVar6[uVar8] != '\0'; uVar8 = uVar8 + 1) {
      if (pcVar6[uVar8] == ']') {
        iVar2 = (int)uVar8;
        if (iVar2 == 0) {
          bVar10 = false;
          coda_set_error(-100,"invalid array index \'\' in path");
        }
        else {
          iVar3 = __isoc99_sscanf(pcVar6,"%ld%n",&local_48,&local_34);
          if ((iVar3 == 1) && (local_34 == iVar2)) {
            iVar3 = coda_cursor_goto_array_element_by_index(cursor,local_48);
            bVar10 = iVar3 == 0;
            if (bVar10) {
              uVar7 = uVar4 + 2 + iVar2;
            }
          }
          else {
            bVar10 = false;
            coda_set_error(-100,"invalid array index \'%.*s\' in path",uVar8 & 0xffffffff,pcVar6);
          }
        }
        goto LAB_0012d5ed;
      }
    }
    bVar10 = false;
    coda_set_error(-100,"invalid path \'%s\' (missing \']\')");
LAB_0012d5ed:
    uVar8 = (ulong)uVar7;
    if (!bVar10) {
      return -1;
    }
  } while( true );
}

Assistant:

LIBCODA_API int coda_cursor_goto(coda_cursor *cursor, const char *path)
{
    coda_type *type = NULL;
    long index;
    int start = 0;
    int end;

    if (path[start] == '/')
    {
        if (coda_cursor_goto_root(cursor) != 0)
        {
            return -1;
        }
        /* skip leading '/' if it is not followed by a record field name */
        if (path[start + 1] == '\0' || path[start + 1] == '/' || path[start + 1] == '[' || path[start + 1] == '@')
        {
            start++;
        }
    }

    while (path[start] != '\0')
    {
        if (path[start] == '@')
        {
            /* attribute */
            if (coda_cursor_goto_attributes(cursor) != 0)
            {
                return -1;
            }
            start++;
            end = start;
            while (path[end] != '\0' && path[end] != '/' && path[end] != '[' && path[end] != '@')
            {
                end++;
            }
            if (end == start + 1 && path[start] == '.')
            {
                /* stay at this position */
            }
            else if (end == start + 2 && path[start] == '.' && path[start + 1] == '.')
            {
                if (coda_cursor_goto_parent(cursor) != 0)
                {
                    return -1;
                }
            }
            else if (end > start)
            {
                if (coda_cursor_get_type(cursor, &type) != 0)
                {
                    return -1;
                }
                if (coda_type_get_record_field_index_from_name_n(type, &path[start], end - start, &index) != 0)
                {
                    return -1;
                }
                if (coda_cursor_goto_record_field_by_index(cursor, index) != 0)
                {
                    return -1;
                }
            }
            start = end;
        }
        else if (path[start] == '[')
        {
            int result;
            int n;

            /* array index */
            start++;
            end = start;
            while (path[end] != '\0' && path[end] != ']')
            {
                end++;
            }
            if (path[end] == '\0')
            {
                coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid path '%s' (missing ']')", path);
                return -1;
            }
            if (start == end)
            {
                coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid array index '' in path");
                return -1;
            }
            result = sscanf(&path[start], "%ld%n", &index, &n);
            if (result != 1 || n != end - start)
            {
                coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid array index '%.*s' in path", end - start,
                               &path[start]);
                return -1;
            }
            if (coda_cursor_goto_array_element_by_index(cursor, index) != 0)
            {
                return -1;
            }
            start = end + 1;
        }
        else
        {
            /* it is Ok to ommit a leading '/' when we start with a field name */
            if (path[start] == '/')
            {
                start++;
            }
            else if (start > 0)
            {
                coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid path '%s' (missing '/'?)", path);
                return -1;
            }
            end = start;
            while (path[end] != '\0' && path[end] != '/' && path[end] != '[' && path[end] != '@')
            {
                end++;
            }
            if (end == start + 1 && path[start] == '.')
            {
                /* stay at this position */
            }
            else if (end == start + 2 && path[start] == '.' && path[start + 1] == '.')
            {
                if (coda_cursor_goto_parent(cursor) != 0)
                {
                    return -1;
                }
            }
            else
            {
                if (coda_cursor_get_type(cursor, &type) != 0)
                {
                    return -1;
                }
                if (coda_type_get_record_field_index_from_name_n(type, &path[start], end - start, &index) != 0)
                {
                    return -1;
                }
                if (coda_cursor_goto_record_field_by_index(cursor, index) != 0)
                {
                    return -1;
                }
            }
            start = end;
        }
    }

    return 0;
}